

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

xmlDocPtr xmlCtxtReadMemory(xmlParserCtxtPtr ctxt,char *buffer,int size,char *URL,char *encoding,
                           int options)

{
  xmlParserInputBufferPtr input;
  xmlParserInputPtr value;
  xmlDocPtr pxVar1;
  
  if (buffer != (char *)0x0 && ctxt != (xmlParserCtxtPtr)0x0) {
    xmlInitParser();
    xmlCtxtReset(ctxt);
    input = xmlParserInputBufferCreateMem(buffer,size,XML_CHAR_ENCODING_NONE);
    if (input != (xmlParserInputBufferPtr)0x0) {
      value = xmlNewIOInputStream(ctxt,input,XML_CHAR_ENCODING_NONE);
      if (value != (xmlParserInputPtr)0x0) {
        inputPush(ctxt,value);
        pxVar1 = xmlDoRead(ctxt,URL,encoding,options,1);
        return pxVar1;
      }
      xmlFreeParserInputBuffer(input);
    }
  }
  return (xmlDocPtr)0x0;
}

Assistant:

xmlDocPtr
xmlCtxtReadMemory(xmlParserCtxtPtr ctxt, const char *buffer, int size,
                  const char *URL, const char *encoding, int options)
{
    xmlParserInputBufferPtr input;
    xmlParserInputPtr stream;

    if (ctxt == NULL)
        return (NULL);
    if (buffer == NULL)
        return (NULL);
    xmlInitParser();

    xmlCtxtReset(ctxt);

    input = xmlParserInputBufferCreateMem(buffer, size, XML_CHAR_ENCODING_NONE);
    if (input == NULL) {
	return(NULL);
    }

    stream = xmlNewIOInputStream(ctxt, input, XML_CHAR_ENCODING_NONE);
    if (stream == NULL) {
	xmlFreeParserInputBuffer(input);
	return(NULL);
    }

    inputPush(ctxt, stream);
    return (xmlDoRead(ctxt, URL, encoding, options, 1));
}